

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O2

boolean breakarm(permonst *ptr)

{
  byte bVar1;
  
  if (ptr->msize < 3) {
    if (ptr->msize == 2) {
      if (ptr != mons + 0x2b && (ptr != mons + 0x133 && (ptr->mflags1 & 0x20000) != 0)) {
        return '\0';
      }
    }
    else if (ptr != mons + 0x2b && ptr != mons + 0x133) {
      return '\0';
    }
  }
  bVar1 = sliparm(ptr);
  return bVar1 ^ 1;
}

Assistant:

boolean breakarm(const struct permonst *ptr)
{
	return ((bigmonst(ptr) || (ptr->msize > MZ_SMALL && !humanoid(ptr)) ||
		/* special cases of humanoids that cannot wear body armor */
		ptr == &mons[PM_MARILITH] || ptr == &mons[PM_WINGED_GARGOYLE])
	      && !sliparm(ptr));
}